

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O3

double atan2d(double y,double x)

{
  double dVar1;
  
  if ((y != 0.0) || (NAN(y))) {
    if ((x == 0.0) && (!NAN(x))) {
      if (0.0 < y) {
        return 90.0;
      }
      if (y < 0.0) {
        return -90.0;
      }
    }
  }
  else {
    if (0.0 <= x) {
      return 0.0;
    }
    if (x < 0.0) {
      return 180.0;
    }
  }
  dVar1 = atan2(y,x);
  return dVar1 * 57.29577951308232;
}

Assistant:

double atan2d(double y, double x) {
    if (y == 0.0) {
        if (x >= 0.0) {
            return 0.0;
        } else if (x < 0.0) {
            return 180.0;
        }
    } else if (x == 0.0) {
        if (y > 0.0) {
            return 90.0;
        } else if (y < 0.0) {
            return -90.0;
        }
    }

    return atan2(y, x) * R2D;
}